

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O0

NOAALRITHeader lrit::getHeader<lrit::NOAALRITHeader>(Buffer *b,int pos)

{
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int in_ESI;
  Buffer *in_RDI;
  HeaderReader<lrit::NOAALRITHeader> r;
  NOAALRITHeader h;
  HeaderReader<lrit::NOAALRITHeader> *in_stack_ffffffffffffffa8;
  HeaderReader<lrit::NOAALRITHeader> local_40;
  NOAALRITHeader local_10;
  
  HeaderReader<lrit::NOAALRITHeader>::HeaderReader(&local_40,in_RDI,in_ESI);
  local_10 = HeaderReader<lrit::NOAALRITHeader>::getHeader(in_stack_ffffffffffffffa8);
  HeaderReader<lrit::NOAALRITHeader>::read(&local_40,(int)&local_10 + 4,(void *)0x4,in_RCX);
  HeaderReader<lrit::NOAALRITHeader>::read(&local_40,(int)&local_10 + 8,__buf,in_RCX);
  HeaderReader<lrit::NOAALRITHeader>::read(&local_40,(int)&local_10 + 10,__buf_00,in_RCX);
  HeaderReader<lrit::NOAALRITHeader>::read(&local_40,(int)&local_10 + 0xc,__buf_01,in_RCX);
  HeaderReader<lrit::NOAALRITHeader>::read(&local_40,(int)&local_10 + 0xe,__buf_02,in_RCX);
  return local_10;
}

Assistant:

NOAALRITHeader getHeader(const Buffer& b, int pos) {
  auto r = HeaderReader<NOAALRITHeader>(b, pos);
  auto h = r.getHeader();
  r.read(h.agencySignature, sizeof(h.agencySignature));
  r.read(&h.productID);
  r.read(&h.productSubID);
  r.read(&h.parameter);
  r.read(&h.noaaSpecificCompression);
  return h;
}